

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm_x86.cpp
# Opt level: O2

int __thiscall
ncnn::GroupNorm_x86::forward_inplace(GroupNorm_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  _func_int **pp_Var2;
  void *pvVar3;
  _func_int **pp_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  int q_1;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  float *pfVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  float *pfVar20;
  int iVar21;
  ulong uVar22;
  int q;
  long lVar23;
  long lVar24;
  int iVar25;
  _func_int *p_Var26;
  long lVar27;
  float *beta;
  long lVar28;
  ulong uVar29;
  float *gamma;
  float *pfVar30;
  long lVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar39;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar40;
  undefined1 auVar38 [16];
  float fVar41;
  
  iVar25 = bottom_top_blob->dims;
  pp_Var2 = this->_vptr_GroupNorm_x86;
  p_Var26 = pp_Var2[-3];
  iVar17 = *(int *)(&this->field_0xd0 + (long)p_Var26);
  uVar14 = (long)*(int *)(&this->field_0xd4 + (long)p_Var26) / (long)iVar17;
  iVar11 = (int)uVar14;
  lVar27 = (long)iVar11;
  if (iVar25 == 2) {
    iVar25 = bottom_top_blob->w;
    iVar15 = iVar25 * iVar11;
    lVar12 = 0;
    if (iVar11 < 1) {
      iVar11 = 0;
    }
    for (lVar31 = 0; lVar31 < iVar17; lVar31 = lVar31 + 1) {
      lVar18 = lVar31 * lVar27;
      pvVar3 = bottom_top_blob->data;
      pfVar30 = (float *)(lVar18 * bottom_top_blob->w * bottom_top_blob->elemsize + (long)pvVar3);
      fVar32 = 0.0;
      fVar33 = 0.0;
      fVar34 = 0.0;
      fVar35 = 0.0;
      lVar23 = 0;
      pfVar16 = pfVar30;
      for (iVar17 = 0; iVar17 + 3 < iVar15; iVar17 = iVar17 + 4) {
        fVar32 = fVar32 + *pfVar16;
        fVar33 = fVar33 + pfVar16[1];
        fVar34 = fVar34 + pfVar16[2];
        fVar35 = fVar35 + pfVar16[3];
        pfVar16 = pfVar16 + 4;
        lVar23 = lVar23 + 4;
      }
      pfVar16 = (float *)(*(long *)(&this->field_0xe0 + (long)p_Var26) +
                         *(long *)(&this->field_0xf0 + (long)p_Var26) * lVar18);
      fVar32 = fVar35 + fVar33 + fVar34 + fVar32;
      lVar19 = bottom_top_blob->elemsize * lVar12 * (long)bottom_top_blob->w;
      for (; (int)lVar23 < iVar15; lVar23 = lVar23 + 1) {
        fVar32 = fVar32 + *(float *)((long)pvVar3 + lVar23 * 4 + lVar19);
      }
      fVar32 = fVar32 * (1.0 / (float)iVar15);
      lVar23 = 0;
      auVar37 = ZEXT816(0);
      iVar17 = 0;
      pfVar20 = pfVar30;
      while( true ) {
        fVar33 = auVar37._4_4_;
        fVar35 = auVar37._12_4_;
        fVar34 = auVar37._8_4_;
        if (iVar15 <= iVar17 + 3) break;
        auVar37._0_4_ = auVar37._0_4_ + (*pfVar20 - fVar32) * (*pfVar20 - fVar32);
        auVar37._4_4_ = fVar33 + (pfVar20[1] - fVar32) * (pfVar20[1] - fVar32);
        auVar37._8_4_ = fVar34 + (pfVar20[2] - fVar32) * (pfVar20[2] - fVar32);
        auVar37._12_4_ = fVar35 + (pfVar20[3] - fVar32) * (pfVar20[3] - fVar32);
        pfVar20 = pfVar20 + 4;
        iVar17 = iVar17 + 4;
        lVar23 = lVar23 + 4;
      }
      fVar35 = fVar35 + fVar33;
      fVar33 = fVar35 + fVar34 + auVar37._0_4_;
      for (; (int)lVar23 < iVar15; lVar23 = lVar23 + 1) {
        fVar34 = *(float *)((long)pvVar3 + lVar23 * 4 + lVar19) - fVar32;
        fVar34 = fVar34 * fVar34;
        auVar37 = ZEXT416((uint)fVar34);
        fVar33 = fVar33 + fVar34;
      }
      fVar34 = fVar33 * (1.0 / (float)iVar15) + *(float *)(&this->field_0xd8 + (long)p_Var26);
      auVar6._4_4_ = fVar35;
      auVar6._0_4_ = fVar34;
      auVar6._8_4_ = fVar35;
      auVar6._12_4_ = fVar35;
      auVar37 = rsqrtss(auVar37,auVar6);
      fVar33 = auVar37._0_4_;
      fVar33 = fVar33 * -0.5 * (fVar34 * fVar33 * fVar33 + -3.0);
      fVar32 = -fVar32 * fVar33;
      if (*(int *)(&this->field_0xdc + (long)p_Var26) == 0) {
        lVar18 = 0;
        for (iVar17 = 0; iVar17 + 3 < iVar15; iVar17 = iVar17 + 4) {
          *pfVar30 = *pfVar30 * fVar33 + fVar32;
          pfVar30[1] = pfVar30[1] * fVar33 + fVar32;
          pfVar30[2] = pfVar30[2] * fVar33 + fVar32;
          pfVar30[3] = pfVar30[3] * fVar33 + fVar32;
          pfVar30 = pfVar30 + 4;
          lVar18 = lVar18 + 4;
        }
        for (; (int)lVar18 < iVar15; lVar18 = lVar18 + 1) {
          *(float *)((long)pvVar3 + lVar18 * 4 + lVar19) =
               *(float *)((long)pvVar3 + lVar18 * 4 + lVar19) * fVar33 + fVar32;
        }
      }
      else {
        pfVar20 = (float *)(*(long *)(&this->field_0x128 + (long)p_Var26) +
                           lVar18 * *(long *)(&this->field_0x138 + (long)p_Var26));
        for (iVar17 = 0; iVar17 != iVar11; iVar17 = iVar17 + 1) {
          fVar35 = *pfVar16 * fVar33;
          fVar34 = *pfVar16 * fVar32 + *pfVar20;
          for (iVar21 = 0; iVar21 + 3 < iVar25; iVar21 = iVar21 + 4) {
            *pfVar30 = *pfVar30 * fVar35 + fVar34;
            pfVar30[1] = pfVar30[1] * fVar35 + fVar34;
            pfVar30[2] = pfVar30[2] * fVar35 + fVar34;
            pfVar30[3] = pfVar30[3] * fVar35 + fVar34;
            pfVar30 = pfVar30 + 4;
          }
          for (; iVar21 < iVar25; iVar21 = iVar21 + 1) {
            *pfVar30 = *pfVar30 * fVar35 + fVar34;
            pfVar30 = pfVar30 + 1;
          }
          pfVar16 = pfVar16 + 1;
          pfVar20 = pfVar20 + 1;
        }
      }
      p_Var26 = pp_Var2[-3];
      iVar17 = *(int *)(&this->field_0xd0 + (long)p_Var26);
      lVar12 = lVar12 + lVar27;
    }
  }
  else if (iVar25 == 1) {
    lVar12 = 0;
    for (lVar31 = 0; lVar31 < iVar17; lVar31 = lVar31 + 1) {
      pvVar3 = bottom_top_blob->data;
      pfVar30 = (float *)(lVar31 * lVar27 * bottom_top_blob->elemsize + (long)pvVar3);
      lVar18 = 0;
      fVar32 = 0.0;
      fVar33 = 0.0;
      fVar34 = 0.0;
      fVar35 = 0.0;
      pfVar16 = pfVar30;
      for (iVar25 = 0; iVar25 + 3 < iVar11; iVar25 = iVar25 + 4) {
        fVar32 = fVar32 + *pfVar16;
        fVar33 = fVar33 + pfVar16[1];
        fVar34 = fVar34 + pfVar16[2];
        fVar35 = fVar35 + pfVar16[3];
        pfVar16 = pfVar16 + 4;
        lVar18 = lVar18 + 4;
      }
      fVar32 = fVar35 + fVar33 + fVar34 + fVar32;
      lVar23 = bottom_top_blob->elemsize * lVar12;
      for (; (int)lVar18 < iVar11; lVar18 = lVar18 + 1) {
        fVar32 = fVar32 + *(float *)((long)pvVar3 + lVar18 * 4 + lVar23);
      }
      fVar32 = fVar32 * (1.0 / (float)iVar11);
      lVar18 = 0;
      auVar36 = ZEXT816(0);
      iVar25 = 0;
      pfVar16 = pfVar30;
      while( true ) {
        fVar33 = auVar36._4_4_;
        fVar35 = auVar36._12_4_;
        fVar34 = auVar36._8_4_;
        if (iVar11 <= iVar25 + 3) break;
        auVar36._0_4_ = auVar36._0_4_ + (*pfVar16 - fVar32) * (*pfVar16 - fVar32);
        auVar36._4_4_ = fVar33 + (pfVar16[1] - fVar32) * (pfVar16[1] - fVar32);
        auVar36._8_4_ = fVar34 + (pfVar16[2] - fVar32) * (pfVar16[2] - fVar32);
        auVar36._12_4_ = fVar35 + (pfVar16[3] - fVar32) * (pfVar16[3] - fVar32);
        pfVar16 = pfVar16 + 4;
        iVar25 = iVar25 + 4;
        lVar18 = lVar18 + 4;
      }
      fVar35 = fVar35 + fVar33;
      fVar33 = fVar35 + fVar34 + auVar36._0_4_;
      for (; (int)lVar18 < iVar11; lVar18 = lVar18 + 1) {
        fVar34 = *(float *)((long)pvVar3 + lVar18 * 4 + lVar23) - fVar32;
        fVar34 = fVar34 * fVar34;
        auVar36 = ZEXT416((uint)fVar34);
        fVar33 = fVar33 + fVar34;
      }
      fVar34 = fVar33 * (1.0 / (float)iVar11) + *(float *)(&this->field_0xd8 + (long)p_Var26);
      auVar5._4_4_ = fVar35;
      auVar5._0_4_ = fVar34;
      auVar5._8_4_ = fVar35;
      auVar5._12_4_ = fVar35;
      auVar37 = rsqrtss(auVar36,auVar5);
      fVar33 = auVar37._0_4_;
      fVar33 = fVar33 * -0.5 * (fVar34 * fVar33 * fVar33 + -3.0);
      fVar32 = -fVar32 * fVar33;
      if (*(int *)(&this->field_0xdc + (long)p_Var26) == 0) {
        lVar18 = 0;
        for (iVar25 = 0; iVar25 + 3 < iVar11; iVar25 = iVar25 + 4) {
          *pfVar30 = *pfVar30 * fVar33 + fVar32;
          pfVar30[1] = pfVar30[1] * fVar33 + fVar32;
          pfVar30[2] = pfVar30[2] * fVar33 + fVar32;
          pfVar30[3] = pfVar30[3] * fVar33 + fVar32;
          pfVar30 = pfVar30 + 4;
          lVar18 = lVar18 + 4;
        }
        for (; (int)lVar18 < iVar11; lVar18 = lVar18 + 1) {
          *(float *)((long)pvVar3 + lVar18 * 4 + lVar23) =
               *(float *)((long)pvVar3 + lVar18 * 4 + lVar23) * fVar33 + fVar32;
        }
      }
      else {
        lVar28 = *(long *)(&this->field_0x128 + (long)p_Var26) +
                 *(long *)(&this->field_0x138 + (long)p_Var26) * lVar12;
        lVar18 = *(long *)(&this->field_0xe0 + (long)p_Var26) +
                 *(long *)(&this->field_0xf0 + (long)p_Var26) * lVar12;
        lVar19 = 0;
        lVar24 = 0;
        for (iVar25 = 0; iVar25 + 3 < iVar11; iVar25 = iVar25 + 4) {
          pfVar16 = (float *)(lVar18 + lVar24);
          fVar34 = pfVar16[1];
          fVar35 = pfVar16[2];
          fVar39 = pfVar16[3];
          pfVar30 = (float *)(lVar28 + lVar24);
          fVar40 = pfVar30[1];
          fVar41 = pfVar30[2];
          fVar7 = pfVar30[3];
          pfVar20 = (float *)((long)pvVar3 + lVar24 + lVar23);
          fVar8 = pfVar20[1];
          fVar9 = pfVar20[2];
          fVar10 = pfVar20[3];
          pfVar1 = (float *)((long)pvVar3 + lVar24 + lVar23);
          *pfVar1 = (*pfVar20 * fVar33 + fVar32) * *pfVar16 + *pfVar30;
          pfVar1[1] = (fVar8 * fVar33 + fVar32) * fVar34 + fVar40;
          pfVar1[2] = (fVar9 * fVar33 + fVar32) * fVar35 + fVar41;
          pfVar1[3] = (fVar10 * fVar33 + fVar32) * fVar39 + fVar7;
          lVar24 = lVar24 + 0x10;
          lVar19 = lVar19 + 4;
        }
        for (; (int)lVar19 < iVar11; lVar19 = lVar19 + 1) {
          *(float *)((long)pvVar3 + lVar19 * 4 + lVar23) =
               (*(float *)((long)pvVar3 + lVar19 * 4 + lVar23) * fVar33 + fVar32) *
               *(float *)(lVar18 + lVar19 * 4) + *(float *)(lVar28 + lVar19 * 4);
        }
      }
      p_Var26 = pp_Var2[-3];
      iVar17 = *(int *)(&this->field_0xd0 + (long)p_Var26);
      lVar12 = lVar12 + lVar27;
    }
  }
  else if (iVar25 - 3U < 2) {
    iVar25 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    uVar29 = 0;
    uVar14 = uVar14 & 0xffffffff;
    if (iVar11 < 1) {
      uVar14 = uVar29;
    }
    fVar32 = 1.0 / (float)(iVar25 * iVar11);
    for (; (long)uVar29 < (long)iVar17; uVar29 = uVar29 + 1) {
      lVar12 = uVar29 * lVar27;
      uVar13 = bottom_top_blob->elemsize;
      lVar18 = bottom_top_blob->cstep * lVar12 * uVar13;
      pvVar3 = bottom_top_blob->data;
      uVar22 = (long)bottom_top_blob->d * uVar13 *
               (long)bottom_top_blob->h * (long)bottom_top_blob->w + 0xf & 0xfffffffffffffff0;
      lVar31 = uVar22 - uVar22 % uVar13;
      fVar33 = 0.0;
      for (uVar13 = 0; uVar13 != uVar14; uVar13 = uVar13 + 1) {
        pfVar16 = (float *)((long)pvVar3 + lVar31 * uVar13 + lVar18);
        fVar34 = 0.0;
        fVar35 = 0.0;
        fVar39 = 0.0;
        fVar40 = 0.0;
        for (iVar17 = 0; iVar17 + 3 < iVar25; iVar17 = iVar17 + 4) {
          fVar34 = fVar34 + *pfVar16;
          fVar35 = fVar35 + pfVar16[1];
          fVar39 = fVar39 + pfVar16[2];
          fVar40 = fVar40 + pfVar16[3];
          pfVar16 = pfVar16 + 4;
        }
        fVar33 = fVar33 + fVar39 + fVar34 + fVar40 + fVar35;
        for (; iVar17 < iVar25; iVar17 = iVar17 + 1) {
          fVar33 = fVar33 + *pfVar16;
          pfVar16 = pfVar16 + 1;
        }
      }
      pfVar16 = (float *)(*(long *)(&this->field_0xe0 + (long)p_Var26) +
                         *(long *)(&this->field_0xf0 + (long)p_Var26) * lVar12);
      fVar33 = fVar33 * fVar32;
      auVar38._4_4_ = fVar33;
      auVar38._0_4_ = fVar33;
      auVar38._8_4_ = fVar33;
      auVar38._12_4_ = fVar33;
      fVar34 = 0.0;
      for (uVar13 = 0; uVar13 != uVar14; uVar13 = uVar13 + 1) {
        pfVar30 = (float *)((long)pvVar3 + lVar31 * uVar13 + lVar18);
        fVar35 = 0.0;
        fVar39 = 0.0;
        fVar40 = 0.0;
        fVar41 = 0.0;
        for (iVar17 = 0; iVar17 + 3 < iVar25; iVar17 = iVar17 + 4) {
          fVar35 = fVar35 + (*pfVar30 - fVar33) * (*pfVar30 - fVar33);
          fVar39 = fVar39 + (pfVar30[1] - fVar33) * (pfVar30[1] - fVar33);
          fVar40 = fVar40 + (pfVar30[2] - fVar33) * (pfVar30[2] - fVar33);
          fVar41 = fVar41 + (pfVar30[3] - fVar33) * (pfVar30[3] - fVar33);
          pfVar30 = pfVar30 + 4;
        }
        fVar34 = fVar34 + fVar40 + fVar35 + fVar41 + fVar39;
        for (; iVar17 < iVar25; iVar17 = iVar17 + 1) {
          fVar34 = fVar34 + (*pfVar30 - fVar33) * (*pfVar30 - fVar33);
          pfVar30 = pfVar30 + 1;
        }
      }
      pfVar30 = (float *)(*(long *)(&this->field_0x128 + (long)p_Var26) +
                         lVar12 * *(long *)(&this->field_0x138 + (long)p_Var26));
      fVar35 = fVar34 * fVar32 + *(float *)(&this->field_0xd8 + (long)p_Var26);
      auVar37 = rsqrtss(auVar38,ZEXT416((uint)fVar35));
      fVar34 = auVar37._0_4_;
      fVar34 = fVar34 * -0.5 * (fVar35 * fVar34 * fVar34 + -3.0);
      pp_Var4 = this->_vptr_GroupNorm_x86;
      for (uVar13 = 0; uVar13 != uVar14; uVar13 = uVar13 + 1) {
        fVar35 = fVar34;
        fVar39 = -fVar33 * fVar34;
        if (*(int *)(&this->field_0xdc + (long)pp_Var4[-3]) != 0) {
          fVar35 = *pfVar16 * fVar34;
          fVar39 = *pfVar16 * -fVar33 * fVar34 + *pfVar30;
        }
        pfVar20 = (float *)((long)pvVar3 + lVar31 * uVar13 + lVar18);
        for (iVar17 = 0; iVar17 + 3 < iVar25; iVar17 = iVar17 + 4) {
          *pfVar20 = *pfVar20 * fVar35 + fVar39;
          pfVar20[1] = pfVar20[1] * fVar35 + fVar39;
          pfVar20[2] = pfVar20[2] * fVar35 + fVar39;
          pfVar20[3] = pfVar20[3] * fVar35 + fVar39;
          pfVar20 = pfVar20 + 4;
        }
        for (; iVar17 < iVar25; iVar17 = iVar17 + 1) {
          *pfVar20 = *pfVar20 * fVar35 + fVar39;
          pfVar20 = pfVar20 + 1;
        }
        pfVar16 = pfVar16 + 1;
        pfVar30 = pfVar30 + 1;
      }
      p_Var26 = pp_Var2[-3];
      iVar17 = *(int *)(&this->field_0xd0 + (long)p_Var26);
    }
  }
  return 0;
}

Assistant:

int GroupNorm_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int channels_per_group = channels / group;

    if (dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < channels_per_group; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < channels_per_group; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < channels_per_group; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / channels_per_group;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / channels_per_group + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                int i = 0;
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _gamma = _mm512_loadu_ps(gamma);
                    __m512 _beta = _mm512_loadu_ps(beta);
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _a = _mm512_mul_ps(_gamma, _scale1_avx512);
                    __m512 _b = _mm512_add_ps(_mm512_mul_ps(_gamma, _scale2_avx512), _beta);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a), _b);
                    _mm512_storeu_ps(ptr, _p);
                    gamma += 16;
                    beta += 16;
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _gamma = _mm256_loadu_ps(gamma);
                    __m256 _beta = _mm256_loadu_ps(beta);
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _a = _mm256_mul_ps(_gamma, _scale1_avx);
                    __m256 _b = _mm256_comp_fmadd_ps(_gamma, _scale2_avx, _beta);
                    _p = _mm256_comp_fmadd_ps(_p, _a, _b);
                    _mm256_storeu_ps(ptr, _p);
                    gamma += 8;
                    beta += 8;
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _gamma = _mm_loadu_ps(gamma);
                    __m128 _beta = _mm_loadu_ps(beta);
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _a = _mm_mul_ps(_gamma, _scale1);
                    __m128 _b = _mm_comp_fmadd_ps(_gamma, _scale2, _beta);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    gamma += 4;
                    beta += 4;
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    *ptr = *ptr * a + b;
                    gamma++;
                    beta++;
                    ptr++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int size = channels_per_group * w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.row_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / size;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / size + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
                for (int q = 0; q < channels_per_group; q++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _a_avx512 = _mm512_set1_ps(a);
                    __m512 _b_avx512 = _mm512_set1_ps(b);
                    for (; i + 15 < w; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                        _mm512_storeu_ps(ptr, _p);
                        ptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _a_avx = _mm256_set1_ps(a);
                    __m256 _b_avx = _mm256_set1_ps(b);
                    for (; i + 7 < w; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                        _mm256_storeu_ps(ptr, _p);
                        ptr += 8;
                    }
#endif // __AVX__
                    __m128 _a = _mm_set1_ps(a);
                    __m128 _b = _mm_set1_ps(b);
                    for (; i + 3 < w; i += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_comp_fmadd_ps(_p, _a, _b);
                        _mm_storeu_ps(ptr, _p);
                        ptr += 4;
                    }
#endif // __SSE2__
                    for (; i < w; i++)
                    {
                        *ptr = *ptr * a + b;
                        ptr++;
                    }
                    gamma++;
                    beta++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / (channels_per_group * size);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / (channels_per_group * size) + eps);
            float scale2 = -mean * scale1;

            const float* gamma = gamma_data_g;
            const float* beta = beta_data_g;
            for (int q = 0; q < channels_per_group; q++)
            {
                float a = scale1;
                float b = scale2;
                if (affine)
                {
                    a = *gamma * a;
                    b = *gamma * b + *beta;
                }

                float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _a_avx512 = _mm512_set1_ps(a);
                __m512 _b_avx512 = _mm512_set1_ps(b);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _a_avx = _mm256_set1_ps(a);
                __m256 _b_avx = _mm256_set1_ps(b);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _a = _mm_set1_ps(a);
                __m128 _b = _mm_set1_ps(b);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * a + b;
                    ptr++;
                }

                gamma++;
                beta++;
            }
        }

        return 0;
    }

    return 0;
}